

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O2

void __thiscall Glucose::Solver::varBumpActivity(Solver *this,Var v,double inc)

{
  double dVar1;
  uint uVar2;
  double *pdVar3;
  ulong uVar4;
  ulong uVar5;
  
  pdVar3 = (this->activity).data;
  dVar1 = pdVar3[v];
  pdVar3[v] = inc + dVar1;
  if (1e+100 < inc + dVar1) {
    uVar2 = (this->vardata).sz;
    uVar5 = 0;
    uVar4 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar4 = uVar5;
    }
    for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      pdVar3[uVar5] = pdVar3[uVar5] * 1e-100;
    }
    this->var_inc = this->var_inc * 1e-100;
  }
  if ((v < (this->order_heap).indices.sz) && (-1 < (this->order_heap).indices.data[v])) {
    Heap<Glucose::Solver::VarOrderLt>::decrease(&this->order_heap,v);
    return;
  }
  return;
}

Assistant:

T&       operator [] (int index)       { return data[index]; }